

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void lua_close(lua_State *L)

{
  StrID *pSVar1;
  global_State *g;
  lua_State *L_00;
  int iVar2;
  TValue *pTVar3;
  uint uVar4;
  
  g = (global_State *)(L->glref).ptr64;
  L_00 = (lua_State *)(g->mainthref).gcptr64;
  luaJIT_profile_stop(L_00);
  (g->cur_L).gcptr64 = 0;
  lj_func_closeuv(L_00,(TValue *)(L_00->stack).ptr64);
  lj_gc_separateudata(g,1);
  pSVar1 = &g[1].str.id;
  *(byte *)pSVar1 = (byte)*pSVar1 & 0xfe;
  g[1].tmptv.field_4.it = 0;
  lj_dispatch_update(g);
  uVar4 = 0;
  do {
    do {
      g->hookmask = g->hookmask | 0x10;
      L_00->status = '\0';
      pTVar3 = (TValue *)((L_00->stack).ptr64 + 0x10);
      L_00->top = pTVar3;
      L_00->base = pTVar3;
      L_00->cframe = (void *)0x0;
      iVar2 = lj_vm_cpcall(L_00,0,0,cpfinalize);
    } while (iVar2 != 0);
    if (8 < uVar4) break;
    uVar4 = uVar4 + 1;
    lj_gc_separateudata(g,1);
  } while ((g->gc).mmudata.gcptr64 != 0);
  close_state(L_00);
  return;
}

Assistant:

LUA_API void lua_close(lua_State *L)
{
  global_State *g = G(L);
  int i;
  L = mainthread(g);  /* Only the main thread can be closed. */
#if LJ_HASPROFILE
  luaJIT_profile_stop(L);
#endif
  setgcrefnull(g->cur_L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_separateudata(g, 1);  /* Separate udata which have GC metamethods. */
#if LJ_HASJIT
  G2J(g)->flags &= ~JIT_F_ON;
  G2J(g)->state = LJ_TRACE_IDLE;
  lj_dispatch_update(g);
#endif
  for (i = 0;;) {
    hook_enter(g);
    L->status = LUA_OK;
    L->base = L->top = tvref(L->stack) + 1 + LJ_FR2;
    L->cframe = NULL;
    if (lj_vm_cpcall(L, NULL, NULL, cpfinalize) == LUA_OK) {
      if (++i >= 10) break;
      lj_gc_separateudata(g, 1);  /* Separate udata again. */
      if (gcref(g->gc.mmudata) == NULL)  /* Until nothing is left to do. */
	break;
    }
  }
  close_state(L);
}